

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_params_util.hpp
# Opt level: O3

void __thiscall
iutest::detail::ParamTestSuiteInfo<CsvParamsIntTest>::OnRegisterTests
          (ParamTestSuiteInfo<CsvParamsIntTest> *this,IParamTestInfoData *infodata)

{
  pfnParamNameGeneratorFunc p_Var1;
  size_type sVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ParamGenerator *pPVar7;
  undefined4 extraout_var;
  ostream *poVar8;
  undefined4 extraout_var_00;
  size_t sVar9;
  pointer generator_name;
  string name;
  string testsuite_name;
  allocator<char> local_249;
  IParamTestInfoData *local_248;
  string local_240;
  string local_220;
  string local_200;
  pointer local_1e0;
  ParamTestSuiteInfo<CsvParamsIntTest> *local_1d8;
  TestParamInfo<int> local_1d0;
  undefined1 local_1c0 [400];
  
  generator_name =
       (this->m_instantiation).
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<CsvParamsIntTest>::Functor>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<CsvParamsIntTest>::Functor>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1e0 = (this->m_instantiation).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<CsvParamsIntTest>::Functor>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<CsvParamsIntTest>::Functor>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (generator_name != local_1e0) {
    local_248 = infodata;
    local_1d8 = this;
    do {
      pPVar7 = (*(generator_name->second).CreateGen)();
      CreateTestSuiteName(&local_200,local_1d8,&generator_name->first);
      iVar5 = (*local_248->_vptr_IParamTestInfoData[2])
                        (local_248,&local_200,
                         &internal::helper::TestTypeIdHelper<CsvParamsIntTest>::_dummy,
                         CsvParamsIntTest::SetUpTestCase,CsvParamsIntTest::TearDownTestCase);
      if (pPVar7 != (ParamGenerator *)0x0) {
        (*pPVar7->_vptr_iuIParamGenerator[2])(pPVar7);
        sVar9 = 0;
        while( true ) {
          cVar3 = (*pPVar7->_vptr_iuIParamGenerator[5])(pPVar7);
          if (cVar3 != '\0') break;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1c0,(local_248->m_name)._M_dataplus._M_p,&local_249);
          p_Var1 = (generator_name->second).ParamNameGen;
          local_1d0.param = (*pPVar7->_vptr_iuIParamGenerator[3])(pPVar7);
          local_1d0.index = sVar9;
          (*p_Var1)(&local_220,&local_1d0);
          sVar2 = local_220._M_string_length;
          local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_240,CONCAT44(local_1c0._4_4_,local_1c0._0_4_),
                     local_1c0._8_8_ + CONCAT44(local_1c0._4_4_,local_1c0._0_4_));
          if (sVar2 != 0) {
            std::__cxx11::string::append((char *)&local_240);
            std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_220._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_) != local_1c0 + 0x10) {
            operator_delete((undefined1 *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_),
                            local_1c0._16_8_ + 1);
          }
          bVar4 = CheckTestName((TestSuite *)CONCAT44(extraout_var,iVar5),&local_240);
          if (!bVar4) {
            IUTestLog::IUTestLog
                      ((IUTestLog *)local_1c0,LOG_WARNING,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/internal/iutest_params_util.hpp"
                       ,0xcb);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)(local_1c0 + 0x18),local_200._M_dataplus._M_p,
                                local_200._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,".",1);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,local_240._M_dataplus._M_p,local_240._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," is already exist.",0x12);
            IUTestLog::~IUTestLog((IUTestLog *)local_1c0);
          }
          iVar6 = (*local_248->_vptr_IParamTestInfoData[3])
                            (local_248,(TestSuite *)CONCAT44(extraout_var,iVar5),&local_240);
          local_1c0._0_4_ = (*pPVar7->_vptr_iuIParamGenerator[3])(pPVar7);
          (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar6) + 0x10))
                    ((long *)CONCAT44(extraout_var_00,iVar6),local_1c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_dataplus._M_p != &local_240.field_2) {
            operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
          }
          sVar9 = sVar9 + 1;
          (*pPVar7->_vptr_iuIParamGenerator[4])(pPVar7);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      if (pPVar7 != (ParamGenerator *)0x0) {
        (*pPVar7->_vptr_iuIParamGenerator[1])(pPVar7);
      }
      generator_name = generator_name + 1;
    } while (generator_name != local_1e0);
  }
  return;
}

Assistant:

virtual void OnRegisterTests(IParamTestInfoData* infodata) const IUTEST_CXX_OVERRIDE
    {
        for( typename InstantiationContainer::const_iterator gen_it=m_instantiation.begin()
            , gen_end=m_instantiation.end(); gen_it != gen_end; ++gen_it )
        {
            // パラメータ生成器の作成
            detail::scoped_ptr<ParamGenerator> p((gen_it->second.CreateGen)());

            const ::std::string testsuite_name = CreateTestSuiteName(gen_it->first);
            const char* file = gen_it->second.m_file;
            const int line = gen_it->second.m_line;
            TestSuite* testsuite = infodata->MakeTestSuite(testsuite_name
                , internal::GetTypeId<Tester>()
                , IUTEST_GET_SETUP_TESTSUITE(Tester, file, line)
                , IUTEST_GET_TEARDOWN_TESTSUITE(Tester, file, line));

            if( p.get() != NULL )
            {
                size_t i=0;
                for( p->Begin(); !p->IsEnd(); p->Next() )
                {
                    const ::std::string name = MakeParamTestName(infodata->GetName()
                        , gen_it->second.ParamNameGen(TestParamInfo<ParamType>(p->GetCurrent(), i)) );
#if IUTEST_CHECK_STRICT
                    if( !CheckTestName(testsuite, name) )
                    {
                        IUTEST_LOG_(WARNING) << testsuite_name << "." << name << " is already exist.";
                    }
#endif
                    EachTest* test = static_cast<EachTest*>(infodata->RegisterTest(testsuite, name));
                    test->SetParam(p->GetCurrent());
                    ++i;
                }
            }
        }
    }